

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deThreadUnix.c
# Opt level: O0

deBool deThread_join(deThread threadptr)

{
  int iVar1;
  int ret;
  Thread *thread;
  deThread threadptr_local;
  
  iVar1 = pthread_join(*(pthread_t *)threadptr,(void **)0x0);
  if (iVar1 != 0) {
    pthread_detach(*(pthread_t *)threadptr);
  }
  *(undefined8 *)threadptr = 0;
  return (deBool)(iVar1 == 0);
}

Assistant:

deBool deThread_join (deThread threadptr)
{
	Thread*		thread	= (Thread*)threadptr;
	int			ret;

	DE_ASSERT(thread->thread);
	ret = pthread_join(thread->thread, DE_NULL);

	/* If join fails for some reason, at least mark as detached. */
	if (ret != 0)
		pthread_detach(thread->thread);

	/* Thread is no longer valid as far as we are concerned. */
	thread->thread = 0;

	return (ret == 0);
}